

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

double cmsys::SystemTools::GetTime(void)

{
  timeval t;
  timeval local_18;
  
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  return (double)local_18.tv_usec * 1e-06 + (double)local_18.tv_sec;
}

Assistant:

double SystemTools::GetTime(void)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  FILETIME ft;
  GetSystemTimeAsFileTime(&ft);
  return (429.4967296 * ft.dwHighDateTime + 0.0000001 * ft.dwLowDateTime -
          11644473600.0);
#else
  struct timeval t;
  gettimeofday(&t, KWSYS_NULLPTR);
  return 1.0 * double(t.tv_sec) + 0.000001 * double(t.tv_usec);
#endif
}